

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Sequence::ChFunction_Sequence
          (ChFunction_Sequence *this,ChFunction_Sequence *other)

{
  list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *this_00;
  
  this_00 = &this->functions;
  (this->super_ChFunction)._vptr_ChFunction = (_func_int **)&PTR__ChFunction_Sequence_01191e90;
  (this->functions).super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->functions).super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->functions).super__List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>.
  _M_impl._M_node._M_size = 0;
  this->start = other->start;
  std::__cxx11::list<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_>::operator=
            (this_00,&other->functions);
  return;
}

Assistant:

ChFunction_Sequence::ChFunction_Sequence(const ChFunction_Sequence& other) {
    start = other.start;
    functions = other.functions;
}